

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

StringPtr * __thiscall
kj::_::NullableValue<kj::StringPtr>::emplace<kj::StringPtr>
          (NullableValue<kj::StringPtr> *this,StringPtr *params)

{
  StringPtr *params_00;
  StringPtr *params_local;
  NullableValue<kj::StringPtr> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::StringPtr>(&(this->field_1).value);
  }
  params_00 = fwd<kj::StringPtr>(params);
  ctor<kj::StringPtr,kj::StringPtr>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (StringPtr *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }